

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

int __thiscall QWidgetPrivate::init(QWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  WindowFlags *flags;
  undefined4 uVar1;
  QWidget *this_00;
  undefined8 uVar2;
  undefined1 opaque;
  QApplication *pQVar3;
  QPalette *this_01;
  QBrush *pQVar4;
  QEvent *this_02;
  int iVar5;
  uint in_EDX;
  int iVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QWidget *q;
  QSet<QWidget_*> local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 | 0x401;
  pQVar3 = QtPrivate::qobject_cast_helper<QApplication*,QObject>(QCoreApplication::self);
  if (pQVar3 == (QApplication *)0x0) {
    local_58.q_hash.d._0_4_ = 2;
    local_44 = 0;
    local_58.q_hash.d._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_40 = "default";
    QMessageLogger::fatal((char *)&local_58,"QWidget: Cannot create a QWidget without QApplication")
    ;
  }
  else {
    if (allWidgets != (QWidgetSet *)0x0) {
      QSet<QWidget_*>::insert(&local_58,(QWidget **)allWidgets);
    }
    (this->data).winid = 0;
    (this->data).widget_attributes = 0;
    (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
    super_QFlagsStorage<Qt::WindowType>.i = in_EDX;
    *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfff80000 | 0x3000;
    if ((in_EDX >> 9 & 1) != 0) {
      this->field_0x252 = this->field_0x252 | 0x80;
      QWidget::setAttribute(this_00,WA_NativeWindow,true);
    }
    QWidget::setAttribute(this_00,WA_QuitOnClose,true);
    adjustQuitOnCloseAttribute(this);
    QWidget::setAttribute(this_00,WA_WState_Hidden,true);
    iVar5 = 0x1d;
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      iVar5 = 0x1df;
    }
    iVar6 = 99;
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      iVar6 = 0x27f;
    }
    (this->data).crect.x1 = 0;
    (this->data).crect.y1 = 0;
    (this->data).crect.x2.m_i = iVar6;
    (this->data).crect.y2.m_i = iVar5;
    initFocusChain(this);
    if ((char)in_EDX == '\x11') {
      QWidget::create(this_00,0,false,false);
    }
    else {
      flags = &(this->data).window_flags;
      if (ctx == (EVP_PKEY_CTX *)0x0) {
        adjustFlags(flags,this_00);
        resolveLayoutDirection(this);
        this_01 = QWidget::palette(this_00);
        pQVar4 = QPalette::brush(this_01,Window);
        if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) ||
           (*(int *)(*(long *)pQVar4 + 4) == 0)) {
          opaque = false;
        }
        else {
          opaque = QBrush::isOpaque();
        }
        setOpaque(this,(bool)opaque);
      }
      else {
        QWidget::setParent(this_00,(QWidget *)ctx,
                           (WindowFlags)
                           (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).
                           super_QFlagsStorage<Qt::WindowType>.i);
      }
    }
    pQVar7 = this_00;
    if (this_00 != (QWidget *)0x0) {
      pQVar7 = (QWidget *)&this_00->super_QPaintDevice;
    }
    QFont::QFont((QFont *)&local_58,&(this->data).fnt,(QPaintDevice *)pQVar7);
    uVar2 = *(undefined8 *)&(this->data).fnt;
    *(ulong *)&(this->data).fnt = CONCAT44(local_58.q_hash.d._4_4_,local_58.q_hash.d._0_4_);
    local_58.q_hash.d._0_4_ = (undefined4)uVar2;
    local_58.q_hash.d._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined4 *)&(this->data).field_0x40;
    *(undefined4 *)&(this->data).field_0x40 = uStack_50;
    uStack_50 = uVar1;
    QFont::~QFont((QFont *)&local_58);
    QWidget::setAttribute(this_00,WA_PendingMoveEvent,true);
    QWidget::setAttribute(this_00,WA_PendingResizeEvent,true);
    if (maxInstances <= instanceCounter) {
      maxInstances = instanceCounter + 1;
    }
    local_58.q_hash.d._0_4_ = 0xaaaaaaaa;
    local_58.q_hash.d._4_4_ = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    instanceCounter = instanceCounter + 1;
    QEvent::QEvent((QEvent *)&local_58,Create);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_58);
    this_02 = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this_02,PolishRequest);
    QCoreApplication::postEvent(&this_00->super_QObject,this_02,0);
    this->extraPaintEngine = (QPaintEngine *)0x0;
    QEvent::~QEvent((QEvent *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::init(QWidget *parentWidget, Qt::WindowFlags f)
{
    Q_Q(QWidget);
    isWidget = true;
    wasWidget = true;

    Q_ASSERT_X(q != parentWidget, Q_FUNC_INFO, "Cannot parent a QWidget to itself");

    if (Q_UNLIKELY(!qobject_cast<QApplication *>(QCoreApplication::instance())))
        qFatal("QWidget: Cannot create a QWidget without QApplication");

    Q_ASSERT(allWidgets);
    if (allWidgets)
        allWidgets->insert(q);

#if QT_CONFIG(thread)
    if (!parent) {
        Q_ASSERT_X(QThread::isMainThread(), "QWidget",
                   "Widgets must be created in the GUI thread.");
    }
#endif

    data.fstrut_dirty = true;

    data.winid = 0;
    data.widget_attributes = 0;
    data.window_flags = f;
    data.window_state = 0;
    data.focus_policy = 0;
    data.context_menu_policy = Qt::DefaultContextMenu;
    data.window_modality = Qt::NonModal;

    data.sizehint_forced = 0;
    data.is_closing = false;
    data.in_show = 0;
    data.in_set_window_state = 0;
    data.in_destructor = false;

    // Widgets with Qt::MSWindowsOwnDC (typically QGLWidget) must have a window handle.
    if (f & Qt::MSWindowsOwnDC) {
        mustHaveWindowHandle = 1;
        q->setAttribute(Qt::WA_NativeWindow);
    }

    q->setAttribute(Qt::WA_QuitOnClose); // might be cleared in adjustQuitOnCloseAttribute()
    adjustQuitOnCloseAttribute();

    q->setAttribute(Qt::WA_WState_Hidden);

    //give potential windows a bigger "pre-initial" size; create() will give them a new size later
    data.crect = parentWidget ? QRect(0,0,100,30) : QRect(0,0,640,480);
    initFocusChain();

    if ((f & Qt::WindowType_Mask) == Qt::Desktop)
        q->create();
    else if (parentWidget)
        q->setParent(parentWidget, data.window_flags);
    else {
        adjustFlags(data.window_flags, q);
        resolveLayoutDirection();
        // opaque system background?
        const QBrush &background = q->palette().brush(QPalette::Window);
        setOpaque(q->isWindow() && background.style() != Qt::NoBrush && background.isOpaque());
    }
    data.fnt = QFont(data.fnt, q);

    q->setAttribute(Qt::WA_PendingMoveEvent);
    q->setAttribute(Qt::WA_PendingResizeEvent);

    if (++QWidgetPrivate::instanceCounter > QWidgetPrivate::maxInstances)
        QWidgetPrivate::maxInstances = QWidgetPrivate::instanceCounter;

    QEvent e(QEvent::Create);
    QCoreApplication::sendEvent(q, &e);
    QCoreApplication::postEvent(q, new QEvent(QEvent::PolishRequest));

    extraPaintEngine = nullptr;
}